

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

char * osc::FindStr4End(char *p)

{
  char *local_18;
  char *p_local;
  
  if (*p == '\0') {
    p_local = p + 4;
  }
  else {
    for (local_18 = p + 3; *local_18 != '\0'; local_18 = local_18 + 4) {
    }
    p_local = local_18 + 1;
  }
  return p_local;
}

Assistant:

static inline const char* FindStr4End( const char *p )
{
	if( p[0] == '\0' )    // special case for SuperCollider integer address pattern
		return p + 4;

    p += 3;

    while( *p )
        p += 4;

    return p + 1;
}